

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

char * __thiscall Am_Value::To_String(Am_Value *this)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Type_Support *pAVar4;
  undefined4 extraout_var_00;
  ostream *poVar5;
  Am_Value_Type in_stack_fffffffffffffe7e;
  ostrstream oss;
  char *pcVar3;
  
  uVar1 = this->type & 0x7000;
  if (uVar1 == 0x4000) {
    pAVar4 = Am_Find_Support(in_stack_fffffffffffffe7e);
    if (pAVar4 == (Am_Type_Support *)0x0) goto LAB_0022c4c4;
    iVar2 = (*pAVar4->_vptr_Am_Type_Support[1])(pAVar4,this);
    pcVar3 = (char *)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    if (((uVar1 != 0x3000) && (uVar1 != 0x2000)) ||
       ((this->value).wrapper_value == (Am_Wrapper *)0x0)) goto LAB_0022c4c4;
    iVar2 = (*(((this->value).wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type[1])
                      ();
    pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  }
  if (pcVar3 != (char *)0x0) {
    return pcVar3;
  }
LAB_0022c4c4:
  std::ostrstream::ostrstream(&oss,To_String::line,0xfa,_S_out);
  poVar5 = ::operator<<((ostream *)&oss,this);
  std::ends<char,std::char_traits<char>>(poVar5);
  std::ostrstream::~ostrstream(&oss);
  return To_String::line;
}

Assistant:

const char *
Am_Value::To_String() const
{
  const char *ret_str = nullptr;
  switch (Am_Type_Class(type)) {
  case Am_WRAPPER:
    if (value.wrapper_value) // complains about const with call to valid
      ret_str = value.wrapper_value->To_String();
    break;
  case Am_METHOD:
    if (value.method_value)
      ret_str = value.method_value->To_String();
    break;
  case Am_ENUM: {
    Am_Type_Support *support = Am_Find_Support(type);
    if (support)
      ret_str = support->To_String(*this);
    break;
  }
  }
  if (ret_str)
    return ret_str;
  else { //use expensive technique
    static char line[250];
    OSTRSTREAM_CONSTR(oss, line, 250, std::ios::out);
    oss << *this << std::ends;
    OSTRSTREAM_COPY(oss, line, 250);
    return line;
  }
}